

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::internal::cpp::IsGroupLike(FieldDescriptor *field)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort *puVar4;
  bool bVar5;
  Nonnull<char_*> pcVar6;
  int iVar7;
  Descriptor *pDVar8;
  undefined8 extraout_RAX;
  long lVar9;
  size_type __rlen;
  ulong __n;
  Nonnull<char_*> local_50;
  ulong local_48;
  char local_40;
  undefined7 uStack_3f;
  
  if (field->type_ == '\n') {
    puVar3 = (ushort *)(field->all_names_).payload_;
    __n = (ulong)*puVar3;
    pDVar8 = FieldDescriptor::message_type(field);
    puVar4 = (ushort *)(pDVar8->all_names_).payload_;
    uVar2 = *puVar4;
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    std::__cxx11::string::resize((ulong)&local_50,(char)uVar2);
    absl::lts_20250127::ascii_internal::AsciiStrToLower
              (local_50,(Nullable<const_char_*>)((long)puVar4 + ~(ulong)uVar2),(ulong)uVar2);
    pcVar6 = local_50;
    bVar5 = true;
    if ((local_48 == __n) &&
       ((__n == 0 || (iVar7 = bcmp((void *)((long)puVar3 + ~__n),local_50,__n), iVar7 == 0)))) {
      bVar5 = false;
    }
    if (pcVar6 != &local_40) {
      operator_delete(pcVar6,CONCAT71(uStack_3f,local_40) + 1);
    }
    if ((!bVar5) && (pDVar8 = FieldDescriptor::message_type(field), pDVar8->file_ == field->file_))
    {
      bVar1 = field->field_0x1;
      pDVar8 = FieldDescriptor::message_type(field);
      lVar9 = 0x20;
      if (((bVar1 & 8) != 0) && (lVar9 = 0x28, (field->field_0x1 & 8) == 0)) {
        IsGroupLike((cpp *)&local_50);
        if (local_50 != (char *)CONCAT71((int7)((ulong)&local_40 >> 8),bVar1)) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      return pDVar8->containing_type_ == *(Descriptor **)(&field->super_SymbolBase + lVar9);
    }
  }
  return false;
}

Assistant:

bool IsGroupLike(const FieldDescriptor& field) {
  // Groups are always tag-delimited, currently specified by a TYPE_GROUP type.
  if (field.type() != FieldDescriptor::TYPE_GROUP) return false;
  // Group fields always are always the lowercase type name.
  if (field.name() != absl::AsciiStrToLower(field.message_type()->name())) {
    return false;
  }

  if (field.message_type()->file() != field.file()) return false;

  // Group messages are always defined in the same scope as the field.  File
  // level extensions will compare NULL == NULL here, which is why the file
  // comparison above is necessary to ensure both come from the same file.
  return field.is_extension() ? field.message_type()->containing_type() ==
                                    field.extension_scope()
                              : field.message_type()->containing_type() ==
                                    field.containing_type();
}